

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase982::run(TestCase982 *this)

{
  Server *this_00;
  char *__n;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  int in_R8D;
  int callCount;
  undefined1 local_220 [56];
  WaitScope waitScope;
  Client client2;
  Own<capnp::_::(anonymous_namespace)::TestThisCap> local_1c0;
  Request<capnproto_test::capnp::test::TestInterface::BarParams,_capnproto_test::capnp::test::TestInterface::BarResults>
  local_1b0;
  Client client;
  EventLoop loop;
  Maybe<capnp::MessageSize> local_128;
  Maybe<capnp::MessageSize> local_110;
  Maybe<capnp::MessageSize> local_f8;
  Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::BarResults>_> local_e0 [3];
  Own<capnp::ResponseHook> local_b0;
  Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::BarResults>_> local_a0 [3];
  Own<capnp::ResponseHook> local_70;
  Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::BarResults>_> local_60 [3];
  Own<capnp::ResponseHook> local_30;
  
  callCount = 0;
  kj::EventLoop::EventLoop(&loop);
  waitScope.busyPollInterval = 0xffffffff;
  waitScope.loop = &loop;
  kj::EventLoop::enterScope(&loop);
  this_00 = (Server *)operator_new(0x20);
  this_00[1]._vptr_Server = (_func_int **)0x0;
  local_220._8_8_ = &this_00->field_0x10;
  this_00->_vptr_Server = (_func_int **)0x658010;
  *(undefined8 *)&this_00->field_0x10 = 0x658048;
  *(int **)&this_00->field_0x8 = &callCount;
  __n = (char *)&kj::_::HeapDisposer<capnp::_::(anonymous_namespace)::TestThisCap>::instance;
  local_1c0.disposer =
       (Disposer *)&kj::_::HeapDisposer<capnp::_::(anonymous_namespace)::TestThisCap>::instance;
  local_220._0_8_ = &kj::_::HeapDisposer<capnp::_::(anonymous_namespace)::TestThisCap>::instance;
  local_1c0.ptr = (TestThisCap *)0x0;
  Capability::Client::makeLocalClient
            ((Client *)&client.field_0x8,(Own<capnp::Capability::Server> *)local_220);
  kj::Own<capnp::Capability::Server>::dispose((Own<capnp::Capability::Server> *)local_220);
  client._vptr_Client = (_func_int **)&Capability::Client::typeinfo;
  local_f8.ptr.isSet = false;
  capnproto_test::capnp::test::TestInterface::Client::barRequest(&local_1b0,&client,&local_f8);
  Request<capnproto_test::capnp::test::TestInterface::BarParams,_capnproto_test::capnp::test::TestInterface::BarResults>
  ::send((Request<capnproto_test::capnp::test::TestInterface::BarParams,_capnproto_test::capnp::test::TestInterface::BarResults>
          *)local_220,(int)&local_1b0,__buf,(size_t)__n,in_R8D);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::BarResults>_>::wait
            (local_60,local_220);
  kj::Own<capnp::ResponseHook>::dispose(&local_30);
  RemotePromise<capnproto_test::capnp::test::TestInterface::BarResults>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestInterface::BarResults> *)local_220);
  kj::Own<capnp::RequestHook>::dispose(&local_1b0.hook);
  if ((callCount != 1) && (kj::_::Debug::minSeverity < 3)) {
    local_220._0_4_ = 1;
    __n = "\"failed: expected \" \"(1) == (callCount)\", 1, callCount";
    in_R8D = 0x4cb0a8;
    kj::_::Debug::log<char_const(&)[36],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x3e0,ERROR,"\"failed: expected \" \"(1) == (callCount)\", 1, callCount",
               (char (*) [36])"failed: expected (1) == (callCount)",(int *)local_220,&callCount);
  }
  capnproto_test::capnp::test::TestInterface::Server::thisCap(&client2,this_00);
  if ((callCount != 1) && (kj::_::Debug::minSeverity < 3)) {
    local_220._0_4_ = 1;
    __n = "\"failed: expected \" \"(1) == (callCount)\", 1, callCount";
    in_R8D = 0x4cb0a8;
    kj::_::Debug::log<char_const(&)[36],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x3e3,ERROR,"\"failed: expected \" \"(1) == (callCount)\", 1, callCount",
               (char (*) [36])"failed: expected (1) == (callCount)",(int *)local_220,&callCount);
  }
  local_110.ptr.isSet = false;
  capnproto_test::capnp::test::TestInterface::Client::barRequest(&local_1b0,&client2,&local_110);
  Request<capnproto_test::capnp::test::TestInterface::BarParams,_capnproto_test::capnp::test::TestInterface::BarResults>
  ::send((Request<capnproto_test::capnp::test::TestInterface::BarParams,_capnproto_test::capnp::test::TestInterface::BarResults>
          *)local_220,(int)&local_1b0,__buf_00,(size_t)__n,in_R8D);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::BarResults>_>::wait
            (local_a0,local_220);
  kj::Own<capnp::ResponseHook>::dispose(&local_70);
  RemotePromise<capnproto_test::capnp::test::TestInterface::BarResults>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestInterface::BarResults> *)local_220);
  kj::Own<capnp::RequestHook>::dispose(&local_1b0.hook);
  if ((callCount != 2) && (kj::_::Debug::minSeverity < 3)) {
    local_220._0_4_ = 2;
    __n = "\"failed: expected \" \"(2) == (callCount)\", 2, callCount";
    in_R8D = 0x4c834a;
    kj::_::Debug::log<char_const(&)[36],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x3e5,ERROR,"\"failed: expected \" \"(2) == (callCount)\", 2, callCount",
               (char (*) [36])"failed: expected (2) == (callCount)",(int *)local_220,&callCount);
  }
  capnproto_test::capnp::test::TestInterface::Client::Client((Client *)local_220,(void *)0x0);
  capnproto_test::capnp::test::TestInterface::Client::operator=(&client,(Client *)local_220);
  kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)(local_220 + 8));
  if ((callCount != 2) && (kj::_::Debug::minSeverity < 3)) {
    local_220._0_4_ = 2;
    __n = "\"failed: expected \" \"(2) == (callCount)\", 2, callCount";
    in_R8D = 0x4c834a;
    kj::_::Debug::log<char_const(&)[36],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x3e9,ERROR,"\"failed: expected \" \"(2) == (callCount)\", 2, callCount",
               (char (*) [36])"failed: expected (2) == (callCount)",(int *)local_220,&callCount);
  }
  local_128.ptr.isSet = false;
  capnproto_test::capnp::test::TestInterface::Client::barRequest(&local_1b0,&client2,&local_128);
  Request<capnproto_test::capnp::test::TestInterface::BarParams,_capnproto_test::capnp::test::TestInterface::BarResults>
  ::send((Request<capnproto_test::capnp::test::TestInterface::BarParams,_capnproto_test::capnp::test::TestInterface::BarResults>
          *)local_220,(int)&local_1b0,__buf_01,(size_t)__n,in_R8D);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::BarResults>_>::wait
            (local_e0,local_220);
  kj::Own<capnp::ResponseHook>::dispose(&local_b0);
  RemotePromise<capnproto_test::capnp::test::TestInterface::BarResults>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestInterface::BarResults> *)local_220);
  kj::Own<capnp::RequestHook>::dispose(&local_1b0.hook);
  if ((callCount != 3) && (kj::_::Debug::minSeverity < 3)) {
    local_220._0_4_ = 3;
    kj::_::Debug::log<char_const(&)[36],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x3eb,ERROR,"\"failed: expected \" \"(3) == (callCount)\", 3, callCount",
               (char (*) [36])"failed: expected (3) == (callCount)",(int *)local_220,&callCount);
  }
  capnproto_test::capnp::test::TestInterface::Client::Client((Client *)local_220,(void *)0x0);
  capnproto_test::capnp::test::TestInterface::Client::operator=(&client2,(Client *)local_220);
  kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)(local_220 + 8));
  if ((callCount != -1) && (kj::_::Debug::minSeverity < 3)) {
    local_220._0_4_ = 0xffffffff;
    kj::_::Debug::log<char_const(&)[37],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x3ef,ERROR,"\"failed: expected \" \"(-1) == (callCount)\", -1, callCount",
               (char (*) [37])"failed: expected (-1) == (callCount)",(int *)local_220,&callCount);
  }
  kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)&client2.field_0x8);
  kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)&client.field_0x8);
  kj::Own<capnp::_::(anonymous_namespace)::TestThisCap>::~Own(&local_1c0);
  kj::WaitScope::~WaitScope(&waitScope);
  kj::EventLoop::~EventLoop(&loop);
  return;
}

Assistant:

TEST(Capability, ThisCap) {
  int callCount = 0;
  kj::EventLoop loop;
  kj::WaitScope waitScope(loop);

  auto server = kj::heap<TestThisCap>(callCount);
  TestThisCap* serverPtr = server;

  test::TestInterface::Client client = kj::mv(server);
  client.barRequest().send().wait(waitScope);
  EXPECT_EQ(1, callCount);

  test::TestInterface::Client client2 = serverPtr->getSelf();
  EXPECT_EQ(1, callCount);
  client2.barRequest().send().wait(waitScope);
  EXPECT_EQ(2, callCount);

  client = nullptr;

  EXPECT_EQ(2, callCount);
  client2.barRequest().send().wait(waitScope);
  EXPECT_EQ(3, callCount);

  client2 = nullptr;

  EXPECT_EQ(-1, callCount);
}